

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_traverse_proto(global_State *g,GCproto *pt)

{
  uint64_t uVar1;
  long local_20;
  ptrdiff_t i;
  GCproto *pt_local;
  global_State *g_local;
  
  uVar1 = (pt->chunkname).gcptr64;
  *(byte *)(uVar1 + 8) = *(byte *)(uVar1 + 8) & 0xfc;
  for (local_20 = -(ulong)pt->sizekgc; local_20 < 0; local_20 = local_20 + 1) {
    if ((*(byte *)(*(long *)((pt->k).ptr64 + local_20 * 8) + 8) & 3) != 0) {
      gc_mark(g,*(GCobj **)((pt->k).ptr64 + local_20 * 8));
    }
  }
  if (pt->trace != 0) {
    gc_marktrace(g,(uint)pt->trace);
  }
  return;
}

Assistant:

static void gc_traverse_proto(global_State *g, GCproto *pt)
{
  ptrdiff_t i;
  gc_mark_str(proto_chunkname(pt));
  for (i = -(ptrdiff_t)pt->sizekgc; i < 0; i++)  /* Mark collectable consts. */
    gc_markobj(g, proto_kgc(pt, i));
#if LJ_HASJIT
  if (pt->trace) gc_marktrace(g, pt->trace);
#endif
}